

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O0

void helper_gvec_abs8_ppc(void *d,void *a,uint32_t desc)

{
  intptr_t oprsz_00;
  char local_38;
  long lStack_30;
  int8_t aa;
  intptr_t i;
  intptr_t oprsz;
  uint32_t desc_local;
  void *a_local;
  void *d_local;
  
  oprsz_00 = simd_oprsz(desc);
  for (lStack_30 = 0; lStack_30 < oprsz_00; lStack_30 = lStack_30 + 1) {
    local_38 = *(char *)((long)a + lStack_30);
    if (local_38 < '\0') {
      local_38 = -local_38;
    }
    *(char *)((long)d + lStack_30) = local_38;
  }
  clear_high(d,oprsz_00,desc);
  return;
}

Assistant:

void HELPER(gvec_abs8)(void *d, void *a, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int8_t)) {
        int8_t aa = *(int8_t *)((char *)a + i);
        *(int8_t *)((char *)d + i) = aa < 0 ? -aa : aa;
    }
    clear_high(d, oprsz, desc);
}